

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

void __thiscall
mprpc::MpRpcServer::on_recv
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,char *data,size_t size)

{
  msgpack_object_union *pmVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  char *pcVar8;
  msgpack_sbuffer *sbuf;
  MsgPackPacker pk;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  undefined1 local_b8 [32];
  msgpack_packer_write local_98;
  unique_lock<std::recursive_mutex> local_90;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  msgpack_object_union local_40;
  
  MpRpcMessage::parse((MpRpcMessage *)local_80,data,size);
  if ((((pointer)local_80._0_8_ != (pointer)0x0) && (*(int *)(local_80._0_8_ + 200) != 0)) &&
     (*(long *)(local_80._0_8_ + 8) != 0)) {
    local_90._M_device = (mutex_type *)(this + 8);
    local_90._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_90);
    local_90._M_owns = true;
    (**(code **)(*(long *)(conn->
                          super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 0x10))(local_b8);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this + 0x30),(key_type *)local_b8);
    pcVar2 = local_b8 + 0x10;
    if ((pointer)local_b8._0_8_ != pcVar2) {
      operator_delete((void *)local_b8._0_8_);
    }
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      (**(code **)(*(long *)(conn->
                            super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr + 0x10))(local_b8);
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(this + 0x30),(key_type *)local_b8);
      (pmVar6->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar6->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 &(conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      if ((pointer)local_b8._0_8_ != pcVar2) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
    uVar7 = std::chrono::_V2::system_clock::now();
    *(undefined8 *)(local_80._0_8_ + 0xd0) = uVar7;
    if (*(long *)(local_80._0_8_ + 8) == 0) {
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (char *)0x0;
      local_b8._16_6_ = 0;
      local_b8._22_2_ = 0;
      local_b8._24_6_ = SUB86(local_b8,0);
      local_b8[0x1e] = (undefined1)((ulong)local_b8 >> 0x30);
      local_b8[0x1f] = (undefined1)((ulong)local_b8 >> 0x38);
      local_98 = msgpack_sbuffer_write;
      pcVar8 = (char *)malloc(0x2000);
      if (pcVar8 != (char *)0x0) {
        local_b8._16_6_ = 0x2000;
        local_b8._22_2_ = 0;
        *pcVar8 = -0x7e;
        local_b8._0_8_ = (pointer)0x1;
        local_b8._8_8_ = pcVar8;
      }
      MsgPackPacker::pack_map_item
                ((MsgPackPacker *)local_b8,"id",*(int32_t *)(local_80._0_8_ + 200));
      local_90._M_device._0_1_ = 0xa5;
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),
                  (char *)&local_90,1);
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),"error",
                  5);
      local_90._M_device._0_1_ = 0x82;
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),
                  (char *)&local_90,1);
      local_90._M_device = (mutex_type *)CONCAT71(local_90._M_device._1_7_,0xa4);
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),
                  (char *)&local_90,1);
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),"code",4
                 );
      local_90._M_device = (mutex_type *)CONCAT44(local_90._M_device._4_4_,0xffffffff);
      (*local_98)((void *)CONCAT17(local_b8[0x1f],CONCAT16(local_b8[0x1e],local_b8._24_6_)),
                  (char *)&local_90,1);
      MsgPackPacker::pack_map_item((MsgPackPacker *)local_b8,"message","empty method");
      peVar4 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (**(code **)(*(long *)peVar4 + 0x20))(peVar4,local_b8._8_8_,local_b8._0_8_);
      free((void *)local_b8._8_8_);
    }
    else {
      puVar3 = *(undefined8 **)this;
      peVar4 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (puVar3 == (undefined8 *)0x0) {
        local_60._8_8_ =
             (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
          }
        }
        local_80._24_8_ = local_80._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
          }
        }
        local_b8._16_6_ = 0x776f6e6b6e75;
        local_b8._22_2_ = 0x206e;
        local_b8._24_6_ = 0x646f6874656d;
        local_b8._8_8_ = (char *)0xe;
        local_b8[0x1e] = '\0';
        local_b8._0_8_ = pcVar2;
        local_60._0_8_ = peVar4;
        send_error_rsp(this,(shared_ptr<mprpc::ClientConnection> *)local_60,
                       (shared_ptr<mprpc::MpRpcMessage> *)(local_80 + 0x10),-1,(string *)local_b8);
        if ((pointer)local_b8._0_8_ != pcVar2) {
          operator_delete((void *)local_b8._0_8_);
        }
        uVar7 = local_60._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_);
          uVar7 = local_60._8_8_;
        }
      }
      else {
        local_40.array.ptr =
             (msgpack_object *)
             (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((msgpack_object_kv *)local_40.array.ptr != (msgpack_object_kv *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pmVar1 = &((local_40.map.ptr)->key).via;
            (pmVar1->array).size = (pmVar1->array).size + 1;
            UNLOCK();
          }
          else {
            pmVar1 = &((local_40.map.ptr)->key).via;
            (pmVar1->array).size = (pmVar1->array).size + 1;
          }
        }
        local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
          }
        }
        local_40.u64 = (uint64_t)peVar4;
        (**(code **)*puVar3)(puVar3,&local_40,local_50);
        uVar7 = local_40.map.ptr;
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          uVar7 = local_40.map.ptr;
        }
      }
      if ((msgpack_object *)uVar7 != (msgpack_object *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

void MpRpcServer::on_recv(shared_ptr<ClientConnection> conn, const char* data, size_t size)
    {
        auto rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg ||
            rpcmsg->id == 0 ||
            rpcmsg->method.empty())
        {
            return;
        }

        {
            unique_lock<recursive_mutex> lock(m_conn_map_lock);
            auto it = m_conn_map.find(conn->id());
            if (it == m_conn_map.end()) m_conn_map[conn->id()] = conn;
        }

        rpcmsg->recv_time = system_clock::now();

        if (rpcmsg->method.size()) {
            if (m_callback)
                m_callback->on_call(conn, rpcmsg);
            else {
                send_error_rsp(conn, rpcmsg, -1, "unknown method");
            }
        }
        else {
            MsgPackPacker pk;
            pk.pack_map(2);
            pk.pack_map_item ("id", rpcmsg->id);
            pk.pack_string   ("error");
            // error -> [ code, message]
            pk.pack_map(2);
            pk.pack_map_item ("code", -1);
            pk.pack_map_item ("message", "empty method");

            conn->send(pk.sb.data, pk.sb.size);
        }
    }